

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
          (QGenericArrayOps<EnumNameValue> *this,qsizetype i,EnumNameValue *args)

{
  qsizetype *pqVar1;
  EnumNameValue **ppEVar2;
  int iVar3;
  Data *pDVar4;
  EnumNameValue *pEVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_b0;
  EnumNameValue local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<EnumNameValue>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010cb9d:
    local_60.name.d.d = (args->name).d.d;
    local_60.name.d.ptr = (args->name).d.ptr;
    local_60.name.d.size = (args->name).d.size;
    if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_60.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_60.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_60.valueStr.d.d = (args->valueStr).d.d;
    local_60.valueStr.d.ptr = (args->valueStr).d.ptr;
    local_60.valueStr.d.size = (args->valueStr).d.size;
    if (&(local_60.valueStr.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_60.valueStr.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_60.valueStr.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar3 = args->value;
    local_60._52_4_ = 0xaaaaaaaa;
    local_60.value = iVar3;
    bVar12 = (this->super_QArrayDataPointer<EnumNameValue>).size != 0;
    QArrayDataPointer<EnumNameValue>::detachAndGrow
              (&this->super_QArrayDataPointer<EnumNameValue>,(uint)(i == 0 && bVar12),1,
               (EnumNameValue **)0x0,(QArrayDataPointer<EnumNameValue> *)0x0);
    qVar11 = local_60.valueStr.d.size;
    pcVar10 = local_60.valueStr.d.ptr;
    pDVar9 = local_60.valueStr.d.d;
    qVar8 = local_60.name.d.size;
    pcVar7 = local_60.name.d.ptr;
    pDVar6 = local_60.name.d.d;
    if (i == 0 && bVar12) {
      pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      local_60.name.d.d = (Data *)0x0;
      pEVar5[-1].name.d.d = pDVar6;
      local_60.name.d.ptr = (char16_t *)0x0;
      pEVar5[-1].name.d.ptr = pcVar7;
      local_60.name.d.size = 0;
      pEVar5[-1].name.d.size = qVar8;
      local_60.valueStr.d.d = (Data *)0x0;
      pEVar5[-1].valueStr.d.d = pDVar9;
      local_60.valueStr.d.ptr = (char16_t *)0x0;
      pEVar5[-1].valueStr.d.ptr = pcVar10;
      local_60.valueStr.d.size = 0;
      pEVar5[-1].valueStr.d.size = qVar11;
      pEVar5[-1].value = iVar3;
      (this->super_QArrayDataPointer<EnumNameValue>).ptr = pEVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b0.sourceCopyConstruct = 0;
      local_b0.nSource = 0;
      local_b0.move = 0;
      local_b0.sourceCopyAssign = 0;
      local_b0.end = (EnumNameValue *)0x0;
      local_b0.last = (EnumNameValue *)0x0;
      local_b0.where = (EnumNameValue *)0x0;
      local_b0.begin = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      local_b0.size = (this->super_QArrayDataPointer<EnumNameValue>).size;
      local_b0.data = &this->super_QArrayDataPointer<EnumNameValue>;
      Inserter::insertOne(&local_b0,i,&local_60);
      (local_b0.data)->ptr = local_b0.begin;
      (local_b0.data)->size = local_b0.size;
      if (&(local_60.valueStr.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_60.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_60.valueStr.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<EnumNameValue>).size == i) &&
       (pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pEVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x6db6db6db6db6db7)) {
      pDVar6 = (args->name).d.d;
      pEVar5[i].name.d.d = pDVar6;
      pEVar5[i].name.d.ptr = (args->name).d.ptr;
      pEVar5[i].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->valueStr).d.d;
      pEVar5[i].valueStr.d.d = pDVar6;
      pEVar5[i].valueStr.d.ptr = (args->valueStr).d.ptr;
      pEVar5[i].valueStr.d.size = (args->valueStr).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar5[i].value = args->value;
    }
    else {
      if ((i != 0) ||
         (pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr,
         (EnumNameValue *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pEVar5))
      goto LAB_0010cb9d;
      pDVar6 = (args->name).d.d;
      pEVar5[-1].name.d.d = pDVar6;
      pEVar5[-1].name.d.ptr = (args->name).d.ptr;
      pEVar5[-1].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->valueStr).d.d;
      pEVar5[-1].valueStr.d.d = pDVar6;
      pEVar5[-1].valueStr.d.ptr = (args->valueStr).d.ptr;
      pEVar5[-1].valueStr.d.size = (args->valueStr).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar5[-1].value = args->value;
      ppEVar2 = &(this->super_QArrayDataPointer<EnumNameValue>).ptr;
      *ppEVar2 = *ppEVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }